

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_iso.c
# Opt level: O3

REF_STATUS
ref_iso_boom_zone(FILE *file,REF_GRID_conflict ref_grid,REF_DBL *field,REF_INT ldim,REF_DBL *center,
                 REF_DBL aoa,REF_DBL phi,REF_DBL h)

{
  ulong uVar1;
  int iVar2;
  REF_MPI pRVar3;
  REF_NODE pRVar4;
  REF_GLOB *pRVar5;
  FILE *__stream;
  uint uVar6;
  int iVar7;
  long lVar8;
  void *my_array;
  REF_DBL *pRVar9;
  REF_DBL *pRVar10;
  REF_INT *sorted_index;
  undefined8 uVar11;
  long lVar12;
  REF_INT ldim_00;
  long lVar13;
  long lVar14;
  char *pcVar15;
  ulong uVar16;
  REF_INT RVar17;
  REF_GRID local_100;
  REF_INT n;
  REF_MPI local_f0;
  REF_DBL *local_e8;
  REF_DBL local_e0;
  REF_DBL *xyzf;
  REF_GRID_conflict ray_grid;
  FILE *local_c8;
  REF_DBL local_c0;
  REF_INT *source;
  REF_DBL *ray_field;
  REF_DBL ds [3];
  REF_DBL dt [3];
  REF_DBL segment0 [3];
  REF_DBL segment1 [3];
  
  pRVar3 = ref_grid->mpi;
  local_e0 = h;
  local_c0 = phi;
  uVar6 = ref_iso_segment(ref_grid,center,aoa,phi,h,segment0,segment1);
  if (uVar6 == 0) {
    lVar8 = 0;
    do {
      ds[lVar8] = segment1[lVar8] - segment0[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    local_f0 = pRVar3;
    local_c8 = (FILE *)file;
    uVar6 = ref_math_normalize(ds);
    if (uVar6 == 0) {
      uVar6 = ref_iso_cast(&ray_grid,&ray_field,ref_grid,field,ldim,segment0,segment1);
      if (uVar6 == 0) {
        pRVar4 = ray_grid->node;
        iVar2 = pRVar4->max;
        lVar8 = (long)iVar2;
        if (lVar8 < 1) {
          iVar7 = 0;
        }
        else {
          lVar12 = 0;
          iVar7 = 0;
          do {
            if (-1 < pRVar4->global[lVar12]) {
              iVar7 = iVar7 + (uint)(pRVar4->ref_mpi->id == pRVar4->part[lVar12]);
            }
            lVar12 = lVar12 + 1;
          } while (lVar8 != lVar12);
        }
        uVar1 = (long)ldim + 3;
        ldim_00 = (REF_INT)uVar1;
        if (iVar7 * ldim_00 < 0) {
          pcVar15 = "malloc local_xyzf of REF_DBL negative";
          uVar11 = 0x344;
LAB_0019d545:
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",
                 uVar11,"ref_iso_boom_zone",pcVar15);
          return 1;
        }
        local_100 = ray_grid;
        my_array = malloc((ulong)(uint)(iVar7 * ldim_00) << 3);
        if (my_array == (void *)0x0) {
          pcVar15 = "malloc local_xyzf of REF_DBL NULL";
          uVar11 = 0x344;
        }
        else {
          local_e8 = ray_field;
          if (iVar2 < 1) {
            RVar17 = 0;
          }
          else {
            pRVar5 = pRVar4->global;
            lVar12 = 0;
            lVar14 = 0;
            RVar17 = 0;
            pRVar9 = ray_field;
            do {
              if ((-1 < pRVar5[lVar14]) && (pRVar4->ref_mpi->id == pRVar4->part[lVar14])) {
                pRVar10 = pRVar4->real;
                lVar13 = 0;
                do {
                  *(undefined8 *)((long)my_array + lVar13 * 8 + (long)(RVar17 * ldim_00) * 8) =
                       *(undefined8 *)((long)pRVar10 + lVar13 * 8 + lVar12);
                  lVar13 = lVar13 + 1;
                } while (lVar13 != 3);
                if (0 < ldim) {
                  uVar16 = 0;
                  do {
                    *(REF_DBL *)((long)my_array + (long)(RVar17 * ldim_00 + 3 + (int)uVar16) * 8) =
                         pRVar9[uVar16];
                    uVar16 = uVar16 + 1;
                  } while ((uint)ldim != uVar16);
                }
                RVar17 = RVar17 + 1;
              }
              lVar14 = lVar14 + 1;
              lVar12 = lVar12 + 0x78;
              pRVar9 = pRVar9 + ldim;
            } while (lVar14 != lVar8);
          }
          if (ray_field != (REF_DBL *)0x0) {
            free(ray_field);
            local_100 = ray_grid;
          }
          ref_grid_free(local_100);
          pRVar3 = local_f0;
          uVar6 = ref_mpi_allconcat(local_f0,ldim_00,RVar17,my_array,&n,&source,&xyzf,3);
          if (uVar6 != 0) {
            pcVar15 = "concat";
            uVar11 = 0x354;
            goto LAB_0019d3d1;
          }
          free(my_array);
          if (pRVar3->id != 0) {
            return 0;
          }
          if (source != (REF_INT *)0x0) {
            free(source);
          }
          RVar17 = n;
          lVar8 = (long)n;
          if (lVar8 < 0) {
            pcVar15 = "malloc t of REF_DBL negative";
            uVar11 = 0x358;
            goto LAB_0019d545;
          }
          pRVar9 = (REF_DBL *)malloc(lVar8 * 8);
          if (pRVar9 == (REF_DBL *)0x0) {
            pcVar15 = "malloc t of REF_DBL NULL";
            uVar11 = 0x358;
          }
          else {
            if (RVar17 != 0) {
              lVar12 = 0;
              pRVar10 = xyzf;
              do {
                lVar14 = 0;
                do {
                  dt[lVar14] = pRVar10[lVar14] - segment0[lVar14];
                  lVar14 = lVar14 + 1;
                } while (lVar14 != 3);
                pRVar9[lVar12] = dt[2] * ds[2] + dt[0] * ds[0] + dt[1] * ds[1];
                lVar12 = lVar12 + 1;
                pRVar10 = pRVar10 + ldim_00;
              } while (lVar12 != lVar8);
            }
            sorted_index = (REF_INT *)malloc(lVar8 * 4);
            if (sorted_index != (REF_INT *)0x0) {
              uVar6 = ref_sort_heap_dbl(RVar17,pRVar9,sorted_index);
              __stream = local_c8;
              if (uVar6 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                       ,0x35f,"ref_iso_boom_zone",(ulong)uVar6,"sort t");
                return uVar6;
              }
              local_f0 = (REF_MPI)sorted_index;
              local_e8 = pRVar9;
              fprintf(local_c8," zone t=\"PHI=%.1f,R=%.1f\"\n",local_c0,local_e0);
              if (0 < n) {
                local_e0 = 4.94065645841247e-324;
                if (1 < ldim_00) {
                  local_e0 = (REF_DBL)(uVar1 & 0xffffffff);
                }
                lVar8 = 0;
                do {
                  pRVar3 = local_f0;
                  if (-3 < ldim) {
                    lVar12 = 0;
                    do {
                      fprintf(__stream," %.15e",
                              xyzf[(long)*(int *)((long)pRVar3 + lVar8 * 4) * uVar1 + lVar12]);
                      lVar12 = lVar12 + 1;
                    } while (SUB84(local_e0,0) != (int)lVar12);
                  }
                  fputc(10,__stream);
                  lVar8 = lVar8 + 1;
                } while (lVar8 < n);
              }
              free(local_f0);
              free(local_e8);
              if (xyzf != (REF_DBL *)0x0) {
                free(xyzf);
              }
              return 0;
            }
            pcVar15 = "malloc order of REF_INT NULL";
            uVar11 = 0x35e;
          }
        }
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",
               uVar11,"ref_iso_boom_zone",pcVar15);
        return 2;
      }
      pcVar15 = "cast";
      uVar11 = 0x33c;
    }
    else {
      pcVar15 = "segment unit vector";
      uVar11 = 0x338;
    }
  }
  else {
    pcVar15 = "seg";
    uVar11 = 0x336;
  }
LAB_0019d3d1:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",uVar11,
         "ref_iso_boom_zone",(ulong)uVar6,pcVar15);
  return uVar6;
}

Assistant:

REF_FCN REF_STATUS ref_iso_boom_zone(FILE *file, REF_GRID ref_grid,
                                     REF_DBL *field, REF_INT ldim,
                                     REF_DBL *center, REF_DBL aoa, REF_DBL phi,
                                     REF_DBL h) {
  REF_DBL segment0[3], segment1[3], ds[3], dt[3];
  REF_GRID ray_grid;
  REF_DBL *ray_field;
  REF_DBL *local_xyzf, *xyzf, *t;
  REF_NODE ref_node;
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_INT node, local_n, n, *source, i, *order;

  RSS(ref_iso_segment(ref_grid, center, aoa, phi, h, segment0, segment1),
      "seg");
  for (i = 0; i < 3; i++) ds[i] = segment1[i] - segment0[i];
  RSS(ref_math_normalize(ds), "segment unit vector");

  RSS(ref_iso_cast(&ray_grid, &ray_field, ref_grid, field, ldim, segment0,
                   segment1),
      "cast");
  ref_node = ref_grid_node(ray_grid);
  local_n = 0;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      local_n++;
    }
  }
  ref_malloc(local_xyzf, local_n * (3 + ldim), REF_DBL);
  local_n = 0;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      for (i = 0; i < 3; i++)
        local_xyzf[i + (3 + ldim) * local_n] = ref_node_xyz(ref_node, i, node);
      for (i = 0; i < ldim; i++)
        local_xyzf[3 + i + (3 + ldim) * local_n] = ray_field[i + node * ldim];
      local_n++;
    }
  }
  ref_free(ray_field);
  ref_grid_free(ray_grid);

  RSS(ref_mpi_allconcat(ref_mpi, 3 + ldim, local_n, local_xyzf, &n, &source,
                        (void **)(&xyzf), REF_DBL_TYPE),
      "concat");
  ref_free(local_xyzf);
  if (ref_mpi_once(ref_mpi)) {
    ref_free(source);
    ref_malloc(t, n, REF_DBL);

    for (node = 0; node < n; node++) {
      for (i = 0; i < 3; i++) dt[i] = xyzf[i + (3 + ldim) * node] - segment0[i];
      t[node] = ref_math_dot(dt, ds);
    }
    ref_malloc(order, n, REF_INT);
    RSS(ref_sort_heap_dbl(n, t, order), "sort t");
    fprintf(file, " zone t=\"PHI=%.1f,R=%.1f\"\n", phi, h);
    for (node = 0; node < n; node++) {
      for (i = 0; i < 3 + ldim; i++) {
        fprintf(file, " %.15e", xyzf[i + (3 + ldim) * order[node]]);
      }
      fprintf(file, "\n");
    }
    ref_free(order);
    ref_free(t);
    ref_free(xyzf);
  }

  return REF_SUCCESS;
}